

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TVA.cpp
# Opt level: O2

void __thiscall MT32Emu::TVA::startDecay(TVA *this)

{
  Bit8u BVar1;
  Bit8u newIncrement;
  
  if (5 < this->phase) {
    return;
  }
  BVar1 = (this->partialParam->tva).envTime[4];
  newIncrement = '\x01';
  if (BVar1 != '\0') {
    newIncrement = -BVar1;
  }
  startRamp(this,'\0',newIncrement,6);
  return;
}

Assistant:

void TVA::startDecay() {
	if (phase >= TVA_PHASE_RELEASE) {
		return;
	}
	Bit8u newIncrement;
	if (partialParam->tva.envTime[4] == 0) {
		newIncrement = 1;
	} else {
		newIncrement = -partialParam->tva.envTime[4];
	}
	// The next time nextPhase() is called, it will think TVA_PHASE_RELEASE has finished and the partial will be aborted
	startRamp(0, newIncrement, TVA_PHASE_RELEASE);
}